

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader_test_cases.cpp
# Opt level: O0

vector<unsigned_int,_std::allocator<unsigned_int>_> *
anon_unknown.dwarf_25ca98::read_data_packed
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,string *data)

{
  bool bVar1;
  back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> __result;
  iterator __first;
  iterator __last;
  undefined1 local_68 [8];
  iterator_range<protozero::const_varint_iterator<unsigned_int>,_std::pair<protozero::const_varint_iterator<unsigned_int>,_protozero::const_varint_iterator<unsigned_int>_>_>
  xit;
  undefined1 local_38 [8];
  pbf_message<(anonymous_namespace)::ExampleMsg> message;
  string *data_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *values;
  
  message.super_pbf_reader.m_tag._3_1_ = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(__return_storage_ptr__);
  protozero::pbf_message<(anonymous_namespace)::ExampleMsg>::
  pbf_message<std::__cxx11::string_const&>
            ((pbf_message<(anonymous_namespace)::ExampleMsg> *)local_38,data);
  while (bVar1 = protozero::pbf_message<(anonymous_namespace)::ExampleMsg>::next
                           ((pbf_message<(anonymous_namespace)::ExampleMsg> *)local_38,
                            repeated_uint32_x,length_delimited), bVar1) {
    protozero::pbf_reader::get_packed_uint32
              ((iterator_range<protozero::const_varint_iterator<unsigned_int>,_std::pair<protozero::const_varint_iterator<unsigned_int>,_protozero::const_varint_iterator<unsigned_int>_>_>
                *)local_68,(pbf_reader *)local_38);
    __first = protozero::
              iterator_range<protozero::const_varint_iterator<unsigned_int>,_std::pair<protozero::const_varint_iterator<unsigned_int>,_protozero::const_varint_iterator<unsigned_int>_>_>
              ::cbegin((iterator_range<protozero::const_varint_iterator<unsigned_int>,_std::pair<protozero::const_varint_iterator<unsigned_int>,_protozero::const_varint_iterator<unsigned_int>_>_>
                        *)local_68);
    __last = protozero::
             iterator_range<protozero::const_varint_iterator<unsigned_int>,_std::pair<protozero::const_varint_iterator<unsigned_int>,_protozero::const_varint_iterator<unsigned_int>_>_>
             ::cend((iterator_range<protozero::const_varint_iterator<unsigned_int>,_std::pair<protozero::const_varint_iterator<unsigned_int>,_protozero::const_varint_iterator<unsigned_int>_>_>
                     *)local_68);
    __result = std::back_inserter<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                         (__return_storage_ptr__);
    std::
    copy<protozero::const_varint_iterator<unsigned_int>,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              (__first,__last,__result);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint32_t> read_data_packed(const std::string& data) {
    std::vector<uint32_t> values;

    protozero::pbf_message<ExampleMsg> message{data};
    while (message.next(ExampleMsg::repeated_uint32_x, protozero::pbf_wire_type::length_delimited)) {
        const auto xit = message.get_packed_uint32();
        std::copy(xit.cbegin(), xit.cend(), std::back_inserter(values));
    }

    return values;
}